

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl-select.c
# Opt level: O0

void select_impl(FILE *out,char *prefix)

{
  int iVar1;
  argon2_impl *impl_00;
  argon2_impl *paVar2;
  uint64_t bench;
  argon2_impl *impl;
  uint64_t best_bench;
  argon2_impl *best_impl;
  undefined1 auStack_28 [4];
  uint i;
  argon2_impl_list impls;
  char *prefix_local;
  FILE *out_local;
  
  best_bench = 0;
  impl = (argon2_impl *)0xffffffff;
  impls.count = (size_t)prefix;
  if (out != (FILE *)0x0) {
    fprintf((FILE *)out,"%sSelecting best fill_segment implementation...\n",prefix);
  }
  argon2_get_impl_list((argon2_impl_list *)auStack_28);
  for (best_impl._4_4_ = 0; (argon2_impl *)(ulong)best_impl._4_4_ < impls.entries;
      best_impl._4_4_ = best_impl._4_4_ + 1) {
    impl_00 = _auStack_28 + best_impl._4_4_;
    if (out != (FILE *)0x0) {
      fprintf((FILE *)out,"%s%s: Checking availability... ",impls.count,impl_00->name);
    }
    if ((impl_00->check == (_func_int *)0x0) || (iVar1 = (*impl_00->check)(), iVar1 != 0)) {
      if (out != (FILE *)0x0) {
        fprintf((FILE *)out,"OK!\n");
        fprintf((FILE *)out,"%s%s: Benchmarking...\n",impls.count,impl_00->name);
      }
      paVar2 = (argon2_impl *)benchmark_impl(impl_00);
      if (out != (FILE *)0x0) {
        fprintf((FILE *)out,"%s%s: Benchmark result: %llu\n",impls.count,impl_00->name,paVar2);
      }
      if (paVar2 < impl) {
        impl = paVar2;
        best_bench = (uint64_t)impl_00;
      }
    }
    else if (out != (FILE *)0x0) {
      fprintf((FILE *)out,"FAILED!\n");
    }
  }
  if (best_bench == 0) {
    if (out != (FILE *)0x0) {
      fprintf((FILE *)out,"%sNo optimized implementation available, using default!\n",impls.count);
    }
  }
  else {
    if (out != (FILE *)0x0) {
      fprintf((FILE *)out,"%sBest implementation: \'%s\' (bench %llu)\n",impls.count,
              *(undefined8 *)best_bench,impl);
    }
    selected_argon_impl.name = *(char **)best_bench;
    selected_argon_impl.check = *(_func_int **)(best_bench + 8);
    selected_argon_impl.fill_segment =
         *(_func_void_argon2_instance_t_ptr_argon2_position_t **)(best_bench + 0x10);
  }
  return;
}

Assistant:

static void select_impl(FILE *out, const char *prefix)
{
    argon2_impl_list impls;
    unsigned int i;
    const argon2_impl *best_impl = NULL;
    uint64_t best_bench = UINT_MAX;

    log_maybe(out, "%sSelecting best fill_segment implementation...\n", prefix);

    argon2_get_impl_list(&impls);

    for (i = 0; i < impls.count; i++) {
        const argon2_impl *impl = &impls.entries[i];
        uint64_t bench;

        log_maybe(out, "%s%s: Checking availability... ", prefix, impl->name);
        if (impl->check != NULL && !impl->check()) {
            log_maybe(out, "FAILED!\n");
            continue;
        }
        log_maybe(out, "OK!\n");

        log_maybe(out, "%s%s: Benchmarking...\n", prefix, impl->name);
        bench = benchmark_impl(impl);
        log_maybe(out, "%s%s: Benchmark result: %llu\n", prefix, impl->name,
                (unsigned long long)bench);

        if (bench < best_bench) {
            best_bench = bench;
            best_impl = impl;
        }
    }

    if (best_impl != NULL) {
        log_maybe(out,
                  "%sBest implementation: '%s' (bench %llu)\n", prefix,
                  best_impl->name, (unsigned long long)best_bench);

        selected_argon_impl = *best_impl;
    } else {
        log_maybe(out,
                  "%sNo optimized implementation available, using default!\n",
                  prefix);
    }
}